

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic21::Run(UnitTest_semantic21 *this)

{
  allocator local_41;
  long *local_40;
  string local_38;
  long *local_18;
  
  std::__cxx11::string::string((string *)&local_38,"function f(...) return ... end",&local_41);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_40,&local_38);
  if (local_40 == (long *)0x0) {
    local_40 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string
              ((string *)&local_38,"\'Semantic(\"function f(...) return ... end\")\'",
               (allocator *)&local_40);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
  }
  else {
    (**(code **)(*local_40 + 8))();
    local_40 = (long *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_38,"function f(...) return function() return ... end end",
             (allocator *)&local_40);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_18,&local_38);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  local_18 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_38,
             "\'{ Semantic(\"function f(...) return function() return ... end end\"); }\' has no luna::SemanticException"
             ,(allocator *)&local_40);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

TEST_CASE(semantic21)
{
    EXPECT_TRUE(Semantic("function f(...) return ... end"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("function f(...) return function() return ... end end");
    });
}